

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::inf_or_nan_writer::operator()
          (inf_or_nan_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  size_t *psVar1;
  inf_or_nan_writer iVar2;
  list<char,_std::allocator<char>_> *plVar3;
  _List_node_base *p_Var4;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar5;
  
  iVar2 = *this;
  if (iVar2 != (inf_or_nan_writer)0x0) {
    plVar3 = it->container;
    p_Var4 = (_List_node_base *)operator_new(0x18);
    *(inf_or_nan_writer *)&p_Var4[1]._M_next = iVar2;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(plVar3->super__List_base<char,_std::allocator<char>_>)._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (*(char **)(this + 8),*(char **)(this + 8) + 3,
                     (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)
                     it->container);
  it->container = (list<char,_std::allocator<char>_> *)bVar5;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (sign)
        *it++ = static_cast<char_type>(sign);
      it = internal::copy_str<char_type>(
            str, str + static_cast<std::size_t>(INF_SIZE), it);
    }